

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cc
# Opt level: O1

vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
* __thiscall
assembler::Assembler::process
          (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
           *__return_storage_ptr__,Assembler *this,VCDU *vcdu)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *p_Var3;
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  *p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  uint id;
  _Rb_tree_header *p_Var7;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  out;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  local_138;
  undefined1 local_120 [16];
  _Head_base<0UL,_assembler::TransportPDU_*,_false> _Stack_110;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_108;
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  local_d8;
  undefined1 local_a8 [8];
  __uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> _Stack_a0;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_98;
  _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  local_68;
  
  local_138.
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  id = vcdu->data_->_M_elems[1] & 0x3f;
  if (id == 0x3f) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_138.
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    p_Var7 = &(this->vcs_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = (this->vcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var7->_M_header;
    for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < (int)id])
    {
      if ((int)id <= (int)p_Var6[1]._M_color) {
        p_Var5 = p_Var6;
      }
    }
    p_Var6 = &p_Var7->_M_header;
    if (((_Rb_tree_header *)p_Var5 != p_Var7) &&
       (p_Var6 = p_Var5, (int)id < (int)p_Var5[1]._M_color)) {
      p_Var6 = &p_Var7->_M_header;
    }
    if ((_Rb_tree_header *)p_Var6 == p_Var7) {
      VirtualChannel::VirtualChannel((VirtualChannel *)local_a8,id);
      p_Var1 = &local_108._M_impl.super__Rb_tree_header;
      local_120._8_8_ = local_a8;
      _Stack_110._M_head_impl =
           (TransportPDU *)
           _Stack_a0._M_t.
           super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
      _Stack_a0._M_t.
      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl =
           (tuple<assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>)
           (_Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
            )0x0;
      if (local_98._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var3 = &local_108;
        local_108._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_108._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_108._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_108._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      else {
        p_Var2 = &local_98._M_impl.super__Rb_tree_header;
        local_108._M_impl.super__Rb_tree_header._M_header._M_color =
             local_98._M_impl.super__Rb_tree_header._M_header._M_color;
        local_108._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_98._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_108._M_impl.super__Rb_tree_header._M_header._M_left =
             local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        local_108._M_impl.super__Rb_tree_header._M_header._M_right =
             local_98._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_98._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header
        ;
        p_Var3 = &local_98;
        local_108._M_impl.super__Rb_tree_header._M_node_count =
             local_98._M_impl.super__Rb_tree_header._M_node_count;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      }
      (p_Var3->_M_impl).super__Rb_tree_header._M_node_count = 0;
      p_Var1 = &local_d8._M_impl.super__Rb_tree_header;
      if (local_68._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
        p_Var4 = &local_d8;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      }
      else {
        p_Var2 = &local_68._M_impl.super__Rb_tree_header;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_color =
             local_68._M_impl.super__Rb_tree_header._M_header._M_color;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_parent =
             local_68._M_impl.super__Rb_tree_header._M_header._M_parent;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
             local_68._M_impl.super__Rb_tree_header._M_header._M_left;
        local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_68._M_impl.super__Rb_tree_header._M_header._M_right;
        (local_68._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header
        ;
        p_Var4 = &local_68;
        local_d8._M_impl.super__Rb_tree_header._M_node_count =
             local_68._M_impl.super__Rb_tree_header._M_node_count;
        local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_68._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
        local_68._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
      }
      (p_Var4->_M_impl).super__Rb_tree_header._M_node_count = 0;
      local_120._0_4_ = id;
      std::
      _Rb_tree<int,std::pair<int_const,assembler::VirtualChannel>,std::_Select1st<std::pair<int_const,assembler::VirtualChannel>>,std::less<int>,std::allocator<std::pair<int_const,assembler::VirtualChannel>>>
      ::_M_emplace_unique<std::pair<int,assembler::VirtualChannel>>
                ((_Rb_tree<int,std::pair<int_const,assembler::VirtualChannel>,std::_Select1st<std::pair<int_const,assembler::VirtualChannel>>,std::less<int>,std::allocator<std::pair<int_const,assembler::VirtualChannel>>>
                  *)this,(pair<int,_assembler::VirtualChannel> *)local_120);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
      ::~_Rb_tree(&local_d8);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_108);
      if (_Stack_110._M_head_impl != (TransportPDU *)0x0) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)&_Stack_110,_Stack_110._M_head_impl);
      }
      _Stack_110._M_head_impl = (TransportPDU *)0x0;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
      ::~_Rb_tree(&local_68);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&local_98);
      if (_Stack_a0._M_t.
          super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
          .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
           )0x0) {
        std::default_delete<assembler::TransportPDU>::operator()
                  ((default_delete<assembler::TransportPDU> *)&_Stack_a0,
                   (TransportPDU *)
                   _Stack_a0._M_t.
                   super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                   .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl);
      }
    }
    p_Var6 = (this->vcs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var5 = &p_Var7->_M_header;
    for (; (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
        p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < (int)id]) {
      if ((int)id <= (int)*(size_t *)(p_Var6 + 1)) {
        p_Var5 = p_Var6;
      }
    }
    if (((_Rb_tree_header *)p_Var5 != p_Var7) &&
       ((int)((_Rb_tree_header *)p_Var5)->_M_node_count <= (int)id)) {
      p_Var7 = (_Rb_tree_header *)p_Var5;
    }
    VirtualChannel::process(__return_storage_ptr__,(VirtualChannel *)(p_Var7 + 1),vcdu);
  }
  std::
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  ::~vector(&local_138);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<SessionPDU>> Assembler::process(const VCDU& vcdu) {
  std::vector<std::unique_ptr<SessionPDU>> out;

  // Ignore fill packets
  auto vcid = vcdu.getVCID();
  if (vcid == 63) {
    return out;
  }

  // Create virtual channel instance if it does not yet exist
  if (vcs_.find(vcid) == vcs_.end()) {
    vcs_.insert(std::make_pair(vcid, VirtualChannel(vcid)));
  }

  // Let virtual channel process VCDU
  auto it = vcs_.find(vcid);
  return it->second.process(vcdu);
}